

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Targa.cpp
# Opt level: O2

void __thiscall TargaImage::~TargaImage(TargaImage *this)

{
  (this->super_Image)._vptr_Image = (_func_int **)&PTR__TargaImage_00109cb0;
  if (0 < this->pos) {
    flush(this);
  }
  operator_delete(this->buffer,3);
  if (this->file != (FileDataSink *)0x0) {
    (*(this->file->super_DataSink)._vptr_DataSink[1])();
    return;
  }
  return;
}

Assistant:

TargaImage::~TargaImage()
{
    if(pos > 0) flush();
    delete buffer;
    delete file;
}